

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall wabt::interp::Thread::Push(Thread *this,Ref ref)

{
  pointer *ppVVar1;
  iterator __position;
  iterator __position_00;
  uint uVar2;
  anon_union_16_6_113bff37_for_Value_0 local_20;
  
  uVar2 = (uint)((ulong)((long)(this->values_).
                               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->values_).
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_20.i32_ = uVar2;
  __position._M_current =
       (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->refs_,__position,&local_20.i32_);
  }
  else {
    *__position._M_current = uVar2;
    (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_20._8_8_ = 0;
  __position_00._M_current =
       (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.ref_.index = (Ref)ref.index;
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::
    _M_realloc_insert<wabt::interp::Value>(&this->values_,__position_00,(Value *)&local_20.v128_);
  }
  else {
    ((__position_00._M_current)->field_0).ref_.index = ref.index;
    *(undefined8 *)((long)&(__position_00._M_current)->field_0 + 8) = 0;
    ppVVar1 = &(this->values_).
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void Thread::Push(Ref ref) {
  refs_.push_back(values_.size());
  values_.push_back(Value::Make(ref));
}